

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O2

vector<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* GetSamplers_abi_cxx11_
            (vector<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,Point2i *resolution)

{
  HaltonSampler *pHVar1;
  Allocator AVar2;
  undefined1 auStack_58 [40];
  pair<pbrt::HaltonSampler_*,_const_char_*> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pHVar1 = (HaltonSampler *)operator_new(0x38);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::HaltonSampler::HaltonSampler(pHVar1,0x100,resolution,PermuteDigits,0,AVar2);
  local_30.second = "Halton 256";
  local_30.first = pHVar1;
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::HaltonSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  local_30.first = (HaltonSampler *)operator_new(0x18);
  (local_30.first)->samplesPerPixel = 0x100;
  (local_30.first)->randomizeStrategy = PermuteDigits;
  (local_30.first)->digitPermutations =
       (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *)
       0x0;
  local_30.second = "Padded Sobol 256";
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::PaddedSobolSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::PaddedSobolSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  pHVar1 = (HaltonSampler *)operator_new(0x20);
  pbrt::ZSobolSampler::ZSobolSampler
            ((ZSobolSampler *)pHVar1,0x100,(Point2i)0x1000000010,PermuteDigits,0);
  local_30.second = "Z Sobol 256";
  local_30.first = pHVar1;
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::ZSobolSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::ZSobolSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  pHVar1 = (HaltonSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler((SobolSampler *)pHVar1,0x100,resolution,None);
  local_30.second = "Sobol 256 Not Randomized";
  local_30.first = pHVar1;
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::SobolSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::SobolSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  pHVar1 = (HaltonSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler((SobolSampler *)pHVar1,0x100,resolution,PermuteDigits);
  local_30.second = "Sobol 256 XOR Scramble";
  local_30.first = pHVar1;
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::SobolSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::SobolSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  pHVar1 = (HaltonSampler *)operator_new(0x20);
  pbrt::SobolSampler::SobolSampler((SobolSampler *)pHVar1,0x100,resolution,Owen);
  local_30.second = "Sobol 256 Owen Scramble";
  local_30.first = pHVar1;
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::SobolSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::SobolSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  local_30.first = (HaltonSampler *)operator_new(0x18);
  (local_30.first)->samplesPerPixel = 0x100;
  (local_30.first)->randomizeStrategy = None;
  (local_30.first)->digitPermutations =
       (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *)
       0x853c49e6748fea9b;
  ((local_30.first)->baseScales).super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0xda3e39cb94b95bdb;
  local_30.second = "Random 256";
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::RandomSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::RandomSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  local_30.first = (HaltonSampler *)operator_new(0x30);
  (local_30.first)->samplesPerPixel = 0x10;
  (local_30.first)->randomizeStrategy = 0x10;
  *(undefined4 *)&(local_30.first)->digitPermutations = 0;
  *(undefined1 *)((long)&(local_30.first)->digitPermutations + 4) = 1;
  ((local_30.first)->baseScales).super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x853c49e6748fea9b;
  ((local_30.first)->baseExponents).super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0xda3e39cb94b95bdb;
  (local_30.first)->multInverse[0] = 0;
  (local_30.first)->multInverse[1] = 0;
  (local_30.first)->haltonIndex = 0;
  local_30.second = "Stratified 16x16";
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::StratifiedSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::StratifiedSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  pHVar1 = (HaltonSampler *)operator_new(0x28);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::PMJ02BNSampler::PMJ02BNSampler((PMJ02BNSampler *)pHVar1,0x100,0,AVar2);
  local_30.second = "PMJ02bn 256";
  local_30.first = pHVar1;
  std::
  pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<pbrt::PMJ02BNSampler_*,_const_char_*,_true>
            ((pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58,(pair<pbrt::PMJ02BNSampler_*,_const_char_*> *)&local_30);
  std::
  vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
  ::emplace_back<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>
            ((vector<std::pair<pbrt::SamplerHandle,std::__cxx11::string>,std::allocator<std::pair<pbrt::SamplerHandle,std::__cxx11::string>>>
              *)__return_storage_ptr__,
             (pair<pbrt::SamplerHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)auStack_58);
  std::__cxx11::string::~string((string *)(auStack_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<SamplerHandle, std::string>> GetSamplers(
    const Point2i &resolution) {
    std::vector<std::pair<SamplerHandle, std::string>> samplers;

    samplers.push_back(std::make_pair(new HaltonSampler(256, resolution), "Halton 256"));
    samplers.push_back(std::make_pair(new PaddedSobolSampler(256, RandomizeStrategy::PermuteDigits),
                                      "Padded Sobol 256"));
    samplers.push_back(std::make_pair(new ZSobolSampler(256, Point2i(16, 16), RandomizeStrategy::PermuteDigits),
                                      "Z Sobol 256"));
    samplers.push_back(
        std::make_pair(new SobolSampler(256, resolution, RandomizeStrategy::None),
                       "Sobol 256 Not Randomized"));
    samplers.push_back(
        std::make_pair(new SobolSampler(256, resolution, RandomizeStrategy::PermuteDigits),
                       "Sobol 256 XOR Scramble"));
    samplers.push_back(
        std::make_pair(new SobolSampler(256, resolution, RandomizeStrategy::Owen),
                       "Sobol 256 Owen Scramble"));
    samplers.push_back(std::make_pair(new RandomSampler(256), "Random 256"));
    samplers.push_back(
        std::make_pair(new StratifiedSampler(16, 16, true), "Stratified 16x16"));
    samplers.push_back(std::make_pair(new PMJ02BNSampler(256), "PMJ02bn 256"));

    return samplers;
}